

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

bool __thiscall FM::OPN::Init(OPN *this,uint c,uint r,bool ip,char *param_4)

{
  bool bVar1;
  char *param_4_local;
  bool ip_local;
  uint r_local;
  uint c_local;
  OPN *this_local;
  
  bVar1 = SetRate(this,c,r,ip);
  if (bVar1) {
    (*(this->super_OPNBase).super_Timer._vptr_Timer[3])();
    OPNBase::SetVolumeFM(&this->super_OPNBase,0);
    OPNBase::SetVolumePSG(&this->super_OPNBase,0);
    SetChannelMask(this,0);
  }
  return bVar1;
}

Assistant:

bool OPN::Init(uint c, uint r, bool ip, const char*)
{
	if (!SetRate(c, r, ip))
		return false;

	Reset();

	SetVolumeFM(0);
	SetVolumePSG(0);
	SetChannelMask(0);
	return true;
}